

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O1

int FmsIOWrite(char *filename,char *protocol,FmsDataCollection dc)

{
  FmsFieldDescriptor fd;
  FmsField field;
  FmsDataCollection dc_00;
  _func_int_FmsIOContext_ptr_char_ptr_FmsInt *p_Var1;
  _func_int_FmsIOContext_ptr_char_ptr_char_ptr *p_Var2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  FmsBasisType basis_type;
  FmsComponent fc;
  char *fd_name;
  char *fdname;
  FmsIOContext ctx;
  FmsInt num_fields;
  FmsInt num_fds;
  FmsFieldType field_type;
  FmsFieldDescriptorType fd_type;
  char *fc_name;
  FmsScalarType dt;
  FmsMetaData md;
  FmsFieldDescriptor *fds;
  char *name;
  FmsField *fields;
  FmsMesh mesh;
  FmsInt fo [3];
  FmsIOFunctions io;
  char tmp [20];
  FmsLayoutType local_194;
  FmsComponent local_190;
  FmsFieldDescriptor local_188;
  char *local_180;
  FmsIOContext local_178;
  FmsInt local_158;
  FmsInt local_150;
  undefined8 local_148;
  FmsInt local_140;
  char *local_138;
  FmsDataCollection local_130;
  FmsScalarType local_124;
  FmsMetaData local_120;
  FmsFieldDescriptor *local_118;
  char *local_110;
  _func_int_FmsIOContext_ptr_char_ptr_char_ptr *local_108;
  char *local_100;
  FmsField *local_f8;
  FmsMesh local_f0;
  ulong local_e8;
  ulong local_e0;
  FmsInt local_d8 [2];
  FmsIOFunctions local_c8;
  char *local_48 [3];
  
  if (filename == (char *)0x0) {
    return 1;
  }
  if (dc == (FmsDataCollection)0x0) {
    return 3;
  }
  local_178.fp = (FILE *)0x0;
  local_178.temp_strings_size = 0;
  local_178.temp_strings_cap = 0x40;
  local_178.temp_strings = (char **)calloc(8,0x40);
  local_c8.open = FmsIOOpen;
  local_c8.close = FmsIOClose;
  local_c8.add_int = FmsIOAddInt;
  local_c8.add_int_array = FmsIOAddIntArray;
  local_c8.add_typed_int_array = FmsIOAddTypedIntArray;
  local_c8.add_float = FmsIOAddFloat;
  local_c8.add_double = FmsIOAddDouble;
  local_c8.add_scalar_array = FmsIOAddScalarArray;
  local_c8.add_string = FmsIOAddString;
  local_c8.has_path = FmsIOHasPath;
  local_c8.get_int = FmsIOGetInt;
  local_c8.get_typed_int_array = FmsIOGetTypedIntArray;
  local_c8.get_scalar_array = FmsIOGetScalarArray;
  local_c8.get_string = FmsIOGetString;
  local_178.fp = (FILE *)fopen(filename,"wt");
  if ((FILE *)local_178.fp == (FILE *)0x0) {
    return 5;
  }
  fprintf((FILE *)local_178.fp,"%s: %lu\n","FMS",100);
  local_118 = (FmsFieldDescriptor *)0x0;
  local_150 = 0;
  local_158 = 0;
  local_100 = (char *)0x0;
  iVar3 = FmsDataCollectionGetName(dc,&local_100);
  if (iVar3 == 0) {
    pcVar4 = join_keys("DataCollection","Name");
    if (pcVar4 == (char *)0x0) goto LAB_0010bfb8;
    fprintf((FILE *)local_178.fp,"%s: %s\n",pcVar4,local_100);
    free(pcVar4);
  }
  iVar7 = 0;
  iVar3 = FmsDataCollectionGetFieldDescriptors(dc,&local_118,&local_150);
  if (iVar3 == 0) {
    pcVar4 = join_keys("DataCollection","NumberOfFieldDescriptors");
    if (pcVar4 == (char *)0x0) {
      bVar9 = false;
    }
    else {
      local_130 = dc;
      fprintf((FILE *)local_178.fp,"%s: %lu\n",pcVar4,local_150);
      free(pcVar4);
      pcVar4 = join_keys("DataCollection","FieldDescriptors");
      if (local_150 == 0) {
        bVar9 = true;
      }
      else {
        uVar8 = 0;
        do {
          sprintf((char *)local_48,"%d",uVar8 & 0xffffffff);
          pcVar5 = join_keys(pcVar4,(char *)local_48);
          fd = local_118[uVar8];
          local_188 = (FmsFieldDescriptor)0x0;
          iVar3 = FmsFieldDescriptorGetName(fd,(char **)&local_188);
          iVar7 = 1;
          if (iVar3 == 0) {
            pcVar6 = join_keys(pcVar5,"Name");
            p_Var2 = local_c8.add_string;
            (*local_c8.add_string)(&local_178,pcVar6,(char *)local_188);
            if (pcVar6 != (char *)0x0) {
              free(pcVar6);
            }
            local_190 = (FmsComponent)0x0;
            iVar3 = FmsFieldDescriptorGetComponent(fd,&local_190);
            iVar7 = 2;
            if (iVar3 == 0) {
              if (local_190 == (FmsComponent)0x0) {
                iVar7 = 3;
              }
              else {
                local_138 = (char *)0x0;
                iVar3 = FmsComponentGetName(local_190,&local_138);
                iVar7 = 4;
                if (iVar3 == 0) {
                  pcVar6 = join_keys(pcVar5,"ComponentName");
                  (*p_Var2)(&local_178,pcVar6,local_138);
                  if (pcVar6 != (char *)0x0) {
                    free(pcVar6);
                  }
                  iVar3 = FmsFieldDescriptorGetType(fd,(FmsFieldDescriptorType *)&local_140);
                  iVar7 = 5;
                  if (iVar3 == 0) {
                    pcVar6 = join_keys(pcVar5,"Type");
                    p_Var1 = local_c8.add_int;
                    (*local_c8.add_int)(&local_178,pcVar6,
                                        (long)(int)(FmsFieldDescriptorType)local_140);
                    if (pcVar6 != (char *)0x0) {
                      free(pcVar6);
                    }
                    iVar3 = FmsFieldDescriptorGetFixedOrder
                                      (fd,(FmsFieldType *)&local_148,&local_194,local_d8);
                    iVar7 = 6;
                    if (iVar3 == 0) {
                      local_e8 = (ulong)(FmsFieldType)local_148;
                      local_e0 = (ulong)local_194;
                      pcVar6 = join_keys(pcVar5,"FixedOrder");
                      (*local_c8.add_int_array)(&local_178,pcVar6,&local_e8,3);
                      if (pcVar6 != (char *)0x0) {
                        free(pcVar6);
                      }
                      local_180 = (char *)0x0;
                      iVar3 = FmsFieldDescriptorGetNumDofs(fd,(FmsInt *)&local_180);
                      iVar7 = 7;
                      if (iVar3 == 0) {
                        pcVar6 = join_keys(pcVar5,"NumDofs");
                        (*p_Var1)(&local_178,pcVar6,(FmsInt)local_180);
                        iVar7 = 0;
                        if (pcVar6 != (char *)0x0) {
                          free(pcVar6);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          if (pcVar5 != (char *)0x0) {
            free(pcVar5);
          }
          bVar9 = iVar7 == 0;
        } while ((bVar9) && (uVar8 = uVar8 + 1, uVar8 < local_150));
      }
      dc = local_130;
      if (pcVar4 != (char *)0x0) {
        free(pcVar4);
      }
    }
    if ((bVar9) && (iVar3 = FmsDataCollectionGetFields(dc,&local_f8,&local_158), iVar3 == 0)) {
      pcVar4 = join_keys("DataCollection","NumberOfFields");
      iVar3 = (*local_c8.add_int)(&local_178,pcVar4,local_158);
      if (iVar3 == 0) {
        if (pcVar4 != (char *)0x0) {
          free(pcVar4);
        }
        local_130 = dc;
        pcVar4 = join_keys("DataCollection","Fields");
        bVar9 = iVar7 == 0;
        if ((local_158 != 0) && (iVar7 == 0)) {
          uVar8 = 0;
          local_110 = pcVar4;
          do {
            bVar9 = false;
            sprintf((char *)&local_e8,"%d",uVar8 & 0xffffffff);
            pcVar5 = join_keys(pcVar4,(char *)&local_e8);
            field = local_f8[uVar8];
            iVar3 = FmsFieldGetName(field,local_48);
            if (iVar3 == 0) {
              pcVar6 = join_keys(pcVar5,"Name");
              local_108 = local_c8.add_string;
              (*local_c8.add_string)(&local_178,pcVar6,local_48[0]);
              if (pcVar6 != (char *)0x0) {
                free(pcVar6);
              }
              bVar9 = false;
              local_188 = (FmsFieldDescriptor)0x0;
              local_190 = (FmsComponent)0x0;
              iVar3 = FmsFieldGet(field,&local_188,(FmsInt *)&local_190,&local_194,&local_124,
                                  &local_138);
              if (iVar3 == 0) {
                pcVar4 = join_keys(pcVar5,"LayoutType");
                p_Var1 = local_c8.add_int;
                (*local_c8.add_int)(&local_178,pcVar4,(FmsInt)local_194);
                if (pcVar4 != (char *)0x0) {
                  free(pcVar4);
                }
                pcVar4 = join_keys(pcVar5,"NumberOfVectorComponents");
                (*p_Var1)(&local_178,pcVar4,(FmsInt)local_190);
                if (pcVar4 != (char *)0x0) {
                  free(pcVar4);
                }
                pcVar4 = local_110;
                if (local_188 != (FmsFieldDescriptor)0x0) {
                  local_180 = (char *)0x0;
                  iVar3 = FmsFieldDescriptorGetName(local_188,&local_180);
                  if (iVar3 == 0) {
                    pcVar6 = join_keys(pcVar5,"FieldDescriptorName");
                    (*local_108)(&local_178,pcVar6,local_180);
                    if (pcVar6 != (char *)0x0) {
                      free(pcVar6);
                    }
                    local_140 = 0;
                    FmsFieldDescriptorGetNumDofs(local_188,&local_140);
                    pcVar6 = join_keys(pcVar5,"Data");
                    (*local_c8.add_scalar_array)
                              (&local_178,pcVar6,local_124,local_138,local_140 * (long)local_190);
                    if (pcVar6 != (char *)0x0) {
                      free(pcVar6);
                    }
                    iVar3 = FmsFieldGetMetaData(field,(FmsMetaData *)&local_148);
                    bVar9 = iVar3 == 0;
                    if ((bVar9) && (CONCAT44(local_148._4_4_,(FmsFieldType)local_148) != 0)) {
                      pcVar6 = join_keys(pcVar5,"MetaData");
                      FmsIOWriteFmsMetaData
                                (&local_178,&local_c8,pcVar6,
                                 (FmsMetaData)CONCAT44(local_148._4_4_,(FmsFieldType)local_148));
                      if (pcVar6 != (char *)0x0) {
                        free(pcVar6);
                      }
                    }
                    goto LAB_0010c1be;
                  }
                }
                bVar9 = false;
              }
            }
LAB_0010c1be:
            if (pcVar5 != (char *)0x0) {
              free(pcVar5);
            }
            uVar8 = uVar8 + 1;
          } while ((bool)(bVar9 & uVar8 < local_158));
        }
        if (pcVar4 != (char *)0x0) {
          free(pcVar4);
        }
        dc_00 = local_130;
        if ((bVar9) && (iVar3 = FmsDataCollectionGetMesh(local_130,&local_f0), iVar3 == 0)) {
          pcVar4 = join_keys("DataCollection","Mesh");
          iVar3 = FmsIOWriteFmsMesh(&local_178,&local_c8,pcVar4,local_f0);
          if (pcVar4 != (char *)0x0) {
            free(pcVar4);
          }
          if ((iVar3 == 0) && (iVar3 = FmsDataCollectionGetMetaData(dc_00,&local_120), iVar3 == 0))
          {
            if (local_120 != (FmsMetaData)0x0) {
              pcVar4 = join_keys("DataCollection","MetaData");
              iVar3 = FmsIOWriteFmsMetaData(&local_178,&local_c8,pcVar4,local_120);
              if (pcVar4 != (char *)0x0) {
                free(pcVar4);
              }
              if (iVar3 != 0) goto LAB_0010bfb8;
            }
            iVar3 = (*local_c8.close)(&local_178);
            return (uint)(iVar3 != 0) << 3;
          }
        }
      }
      else if (pcVar4 != (char *)0x0) {
        free(pcVar4);
      }
    }
  }
LAB_0010bfb8:
  (*local_c8.close)(&local_178);
  return 7;
}

Assistant:

int
FmsIOWrite(const char *filename, const char *protocol, FmsDataCollection dc) {
  FmsIOContext ctx;
  FmsIOFunctions io;

  if(filename == NULL) E_RETURN(1);
  if(protocol == NULL) protocol = "ascii";
  if(!dc) E_RETURN(3);

#ifdef FMS_HAVE_CONDUIT
  int isSupported = CheckProtocolSupportConduit(protocol);
  if(isSupported == 1) {
    FmsIOContextInitializeConduit(&ctx, protocol);
    FmsIOFunctionsInitializeConduit(&io);
  } else if(isSupported == 2) {
    FmsIOContextInitialize(&ctx);
    FmsIOFunctionsInitialize(&io);
  } else if(isSupported == 0) {
    // fprintf(stderr, "The protocol %s is not supported by this Conduit runtime.", protocol);
    return 2;
  } else {
    E_RETURN(4);
  }
#else
  FmsIOContextInitialize(&ctx);
  FmsIOFunctionsInitialize(&io);
#endif

  /* "open" the file. */
  if((*io.open)(&ctx, filename, "wt") == 0) {
    // FMS format version of this writer: 100 = v0.1
    const FmsInt fms_format_version = 100;
    if((*io.add_int)(&ctx, "FMS", fms_format_version) != 0) {
      /* "close" the file. */
      (*io.close)(&ctx);
      E_RETURN(6);
    }

    if(FmsIOWriteFmsDataCollection(&ctx, &io, "DataCollection", dc) != 0) {
      /* "close" the file. */
      (*io.close)(&ctx);
      E_RETURN(7);
    }

    if((*io.close)(&ctx) != 0)
      E_RETURN(8);
  } else {
    E_RETURN(5);
  }

  return 0;
}